

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContext::RebindPreparedStatement
          (ClientContext *this,ClientContextLock *lock,string *query,
          shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  idx_t iVar1;
  PreparedStatementData *pPVar2;
  pointer pSVar3;
  InternalException *this_00;
  string *query_00;
  allocator local_59;
  long *local_58;
  shared_ptr<duckdb::PreparedStatementData,_true> new_prepared;
  
  pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
  if ((pPVar2->unbound_statement).
      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl != (SQLStatement *)0x0) {
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
    pSVar3 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(&pPVar2->unbound_statement);
    (*pSVar3->_vptr_SQLStatement[3])
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                *)&local_58,pSVar3);
    CreatePreparedStatement
              ((ClientContext *)&new_prepared,(ClientContextLock *)this,query_00,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               query,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                      *)&local_58,(PreparedStatementMode)(parameters->parameters).ptr);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
    iVar1 = (pPVar2->properties).parameter_count;
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&new_prepared);
    (pPVar2->properties).parameter_count = iVar1;
    shared_ptr<duckdb::PreparedStatementData,_true>::operator=(prepared,&new_prepared);
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
    (pPVar2->properties).bound_all_parameters = false;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_prepared.internal.
                super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&new_prepared,
             "ClientContext::RebindPreparedStatement called but PreparedStatementData did not have an unbound statement so rebinding cannot be done"
             ,&local_59);
  InternalException::InternalException(this_00,(string *)&new_prepared);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ClientContext::RebindPreparedStatement(ClientContextLock &lock, const string &query,
                                            shared_ptr<PreparedStatementData> &prepared,
                                            const PendingQueryParameters &parameters) {
	if (!prepared->unbound_statement) {
		throw InternalException("ClientContext::RebindPreparedStatement called but PreparedStatementData did not have "
		                        "an unbound statement so rebinding cannot be done");
	}
	// catalog was modified: rebind the statement before execution
	auto new_prepared =
	    CreatePreparedStatement(lock, query, prepared->unbound_statement->Copy(), parameters.parameters);
	D_ASSERT(new_prepared->properties.bound_all_parameters);
	new_prepared->properties.parameter_count = prepared->properties.parameter_count;
	prepared = std::move(new_prepared);
	prepared->properties.bound_all_parameters = false;
}